

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O2

void __thiscall
CTxIn::CTxIn(CTxIn *this,Txid hashPrevTx,uint32_t nOut,CScript scriptSigIn,uint32_t nSequenceIn)

{
  long lVar1;
  uint32_t in_ECX;
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(this->scriptSig).super_CScriptBase._union + 0x10) = 0;
  *(undefined8 *)((long)&(this->scriptSig).super_CScriptBase._union + 0x18) = 0;
  (this->scriptSig).super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->scriptSig).super_CScriptBase._union + 8) = 0;
  (this->scriptWitness).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scriptWitness).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scriptWitness).stack.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)(this->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)((this->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
  *(undefined8 *)((this->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)((this->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       hashPrevTx.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_;
  (this->prevout).n = nOut;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(this->scriptSig).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             CONCAT44(in_register_00000014,nSequenceIn));
  this->nSequence = in_ECX;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTxIn::CTxIn(Txid hashPrevTx, uint32_t nOut, CScript scriptSigIn, uint32_t nSequenceIn)
{
    prevout = COutPoint(hashPrevTx, nOut);
    scriptSig = scriptSigIn;
    nSequence = nSequenceIn;
}